

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NetworkUpdateParameters::SharedCtor(NetworkUpdateParameters *this)

{
  this->shuffle_ = (BoolParameter *)0x0;
  this->seed_ = (Int64Parameter *)0x0;
  this->optimizer_ = (Optimizer *)0x0;
  this->epochs_ = (Int64Parameter *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void NetworkUpdateParameters::SharedCtor() {
  ::memset(&optimizer_, 0, reinterpret_cast<char*>(&seed_) -
    reinterpret_cast<char*>(&optimizer_) + sizeof(seed_));
  _cached_size_ = 0;
}